

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O0

ze_result_t driver::zetMetricQueryReset(zet_metric_query_handle_t hMetricQuery)

{
  zet_pfnMetricQueryReset_t pfnReset;
  ze_result_t result;
  zet_metric_query_handle_t hMetricQuery_local;
  
  pfnReset._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c920 != (code *)0x0) {
    pfnReset._4_4_ = (*DAT_0011c920)(hMetricQuery);
  }
  return pfnReset._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricQueryReset(
        zet_metric_query_handle_t hMetricQuery          ///< [in] handle of metric query
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnReset = context.zetDdiTable.MetricQuery.pfnReset;
        if( nullptr != pfnReset )
        {
            result = pfnReset( hMetricQuery );
        }
        else
        {
            // generic implementation
        }

        return result;
    }